

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserKeyword.cpp
# Opt level: O1

bool __thiscall
Rml::PropertyParserKeyword::ParseValue
          (PropertyParserKeyword *this,Property *property,String *value,ParameterMap *parameters)

{
  pointer pcVar1;
  Node *pNVar2;
  size_t sVar3;
  Node *pNVar4;
  String local_68;
  undefined1 local_48 [40];
  
  pcVar1 = (value->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + value->_M_string_length);
  StringUtilities::ToLower(&local_68);
  sVar3 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)parameters,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  pNVar4 = parameters->mKeyVals + sVar3;
  if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pNVar2 = (Node *)parameters->mInfo;
  if (pNVar4 != pNVar2) {
    local_48._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_48,(pNVar4->mData).second);
    Variant::operator=(&property->value,(Variant *)local_48);
    Variant::~Variant((Variant *)local_48);
    property->unit = KEYWORD;
  }
  return pNVar4 != pNVar2;
}

Assistant:

bool PropertyParserKeyword::ParseValue(Property& property, const String& value, const ParameterMap& parameters) const
{
	ParameterMap::const_iterator iterator = parameters.find(StringUtilities::ToLower(value));
	if (iterator == parameters.end())
		return false;

	property.value = Variant((*iterator).second);
	property.unit = Unit::KEYWORD;

	return true;
}